

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void test_all_maps<HashObject<256,32>>(int obj_size,int iters)

{
  int iVar1;
  _Base_ptr p_Var2;
  ushort uVar3;
  _Rb_tree_color _Var4;
  uchar *puVar5;
  HashObject<256,_32> *pHVar6;
  iterator iVar7;
  iterator iVar8;
  nonempty_iterator ppVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  long lVar12;
  value_type *pvVar13;
  long lVar14;
  value_type *pvVar15;
  pointer ppVar16;
  mapped_type *pmVar17;
  iterator iVar18;
  mapped_type *pmVar19;
  const_iterator cVar20;
  iterator iVar21;
  pointer end_memory;
  pointer psVar22;
  pointer end_memory_00;
  pointer end_memory_01;
  size_t start_memory;
  size_t start_memory_00;
  pointer psVar23;
  pointer psVar24;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  size_t start_memory_05;
  size_t start_memory_06;
  int iVar25;
  uint uVar26;
  size_type req_elements;
  _Base_ptr p_Var27;
  _Base_ptr p_Var28;
  _Base_ptr p_Var29;
  _Base_ptr p_Var30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<256,_32>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<256,_32>,_int>_>_>
  pVar48;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set_14;
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  undefined1 local_418 [8];
  const_iterator cStack_410;
  const_iterator local_408;
  const_iterator cStack_400;
  pointer local_3f8;
  const_iterator cStack_3f0;
  undefined1 local_3e8 [216];
  pointer local_310;
  undefined1 local_308 [16];
  _Base_ptr local_2f8;
  _Base_ptr local_2f0;
  _Base_ptr local_2e8;
  size_t local_2e0;
  int local_1e8;
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  local_1e0 [10];
  size_type local_e8;
  size_type local_d8;
  pointer local_c8;
  sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  local_c0;
  iterator local_78;
  
  end_memory_01 = (pointer)(ulong)(uint)obj_size;
  iVar21._M_current = end_memory_01;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",0x100);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar13 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
      pvVar13->second = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  req_elements = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_308,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar13 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
      pvVar13->second = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar13 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
      pvVar13->second = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar13 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
      pvVar13->second = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar21._M_current =
         (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = end_memory_01[-1].bitmap + 5;
    auVar31._8_4_ = (int)puVar5;
    auVar31._0_8_ = puVar5;
    auVar31._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar31 = auVar31 ^ _DAT_0013b020;
    auVar46 = _DAT_0013b010;
    do {
      auVar45 = auVar46 ^ auVar47;
      if ((bool)(~(auVar31._4_4_ < auVar45._4_4_ ||
                  auVar31._0_4_ < auVar45._0_4_ && auVar45._4_4_ == auVar31._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar45._12_4_ <= auVar31._12_4_ &&
          (auVar45._8_4_ <= auVar31._8_4_ || auVar45._12_4_ != auVar31._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
             (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar12 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar12 + 2;
    } while (iVar21._M_current != psVar22);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseSparseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar21._M_current =
         (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = end_memory_01[-1].bitmap + 5;
    auVar32._8_4_ = (int)puVar5;
    auVar32._0_8_ = puVar5;
    auVar32._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar32 = auVar32 ^ _DAT_0013b020;
    auVar45 = _DAT_0013b010;
    do {
      auVar46 = auVar45 ^ auVar47;
      if ((bool)(~(auVar32._4_4_ < auVar46._4_4_ ||
                  auVar32._0_4_ < auVar46._0_4_ && auVar46._4_4_ == auVar32._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar46._12_4_ <= auVar32._12_4_ &&
          (auVar46._8_4_ <= auVar32._8_4_ || auVar46._12_4_ != auVar32._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
             (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar12 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 2;
      auVar45._8_8_ = lVar12 + 2;
    } while (iVar21._M_current != psVar22);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  local_310 = end_memory_01;
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  uVar26 = 1;
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      google::
      sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
      ::find<HashObject<256,32>>
                (&local_78,
                 (sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                  *)local_308,(HashObject<256,_32> *)local_418);
      local_c0.pos.row_begin._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c0.pos.row_end._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.pos.row_current._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.pos.col_current = (pointer)0x0;
      local_c0.end.row_begin._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c0.end.row_end._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.end.row_current._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.end.col_current = (nonempty_iterator)0x0;
      local_c0.ht = (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                     *)local_308;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::advance_past_deleted(&local_c0);
      uVar11 = 1;
      iVar21._M_current = local_78.pos.row_begin._M_current;
      if (((local_78.pos.row_begin._M_current == local_c0.pos.row_begin._M_current) &&
          (iVar21._M_current = local_78.pos.row_end._M_current,
          local_78.pos.row_end._M_current == local_c0.pos.row_end._M_current)) &&
         (local_78.pos.row_current._M_current == local_c0.pos.row_current._M_current)) {
        if (local_78.pos.row_current._M_current == local_78.pos.row_end._M_current) {
          uVar11 = 0;
        }
        else {
          uVar11 = (uint)(local_78.pos.col_current != local_c0.pos.col_current);
          iVar21._M_current =
               (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                *)local_78.pos.col_current;
        }
      }
      uVar26 = uVar26 ^ uVar11;
      iVar25 = iVar25 + 1;
    } while (obj_size != iVar25);
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_fetch_empty",(double)(lVar14 - lVar12),obj_size,start_memory,(size_t)iVar21._M_current
        );
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar13 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
      pvVar13->second = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      google::
      sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar13 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_418);
      iVar1 = iVar25 + 1;
      pvVar13->second = iVar1;
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      google::
      sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(key_type *)local_418);
      iVar25 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,
         (size_t)iVar21._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar13 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
      pvVar13->second = iVar25;
    } while (obj_size != iVar25);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::begin(&local_78,
          (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
           *)local_308);
  local_418 = (undefined1  [8])local_78.ht;
  cStack_410._M_current = local_78.pos.row_begin._M_current;
  local_408._M_current = local_78.pos.row_end._M_current;
  cStack_400._M_current = local_78.pos.row_current._M_current;
  local_3f8 = local_78.pos.col_current;
  cStack_3f0._M_current = local_78.end.row_begin._M_current;
  local_3e8[8] = (char)local_78.end.row_current._M_current;
  local_3e8[9] = local_78.end.row_current._M_current._1_1_;
  local_3e8[10] = local_78.end.row_current._M_current._2_1_;
  local_3e8[0xb] = local_78.end.row_current._M_current._3_1_;
  local_3e8[0xc] = local_78.end.row_current._M_current._4_1_;
  local_3e8[0xd] = local_78.end.row_current._M_current._5_1_;
  local_3e8[0xe] = local_78.end.row_current._M_current._6_1_;
  local_3e8[0xf] = local_78.end.row_current._M_current._7_1_;
  local_3e8._16_8_ = local_78.end.col_current;
  local_78.pos.row_begin._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.pos.row_end._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.row_current._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.col_current = (pointer)0x0;
  local_78.end.row_begin._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.end.row_end._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.row_current._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.col_current = (nonempty_iterator)0x0;
  local_78.ht = (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                 *)local_308;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::advance_past_deleted(&local_78);
  ppVar9 = local_78.pos.col_current;
  iVar8._M_current = local_78.pos.row_current._M_current;
  iVar7._M_current = local_78.pos.row_end._M_current;
  iVar21._M_current = local_78.pos.row_begin._M_current;
  uVar26 = 1;
  do {
    if (cStack_410._M_current == iVar21._M_current) {
      if (((local_408._M_current == iVar7._M_current) && (cStack_400._M_current == iVar8._M_current)
          ) && (iVar8._M_current == iVar7._M_current || local_3f8 == ppVar9)) break;
    }
    uVar26 = uVar26 ^ local_3f8->second;
    local_3f8 = local_3f8 + 1;
    uVar3 = ((cStack_400._M_current)->settings).num_buckets;
    cVar20._M_current = cStack_400._M_current;
    if (local_3f8 ==
        (pointer)((&(*(pointer *)&(cStack_400._M_current)->group)->first)[uVar3].buffer_ +
                 (ulong)uVar3 * 4 + -4)) {
      do {
        cVar20._M_current =
             (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
              *)((((pointer)cStack_400._M_current)->first).buffer_ + 0xc);
        if (cVar20._M_current == local_408._M_current) break;
        local_3f8 = *(pointer *)&((pointer)cVar20._M_current)->first;
        pHVar6 = &((pointer)cStack_400._M_current)->first;
        cStack_400._M_current = cVar20._M_current;
      } while (*(short *)(pHVar6->buffer_ + 0x14) == 0);
    }
    cStack_400._M_current = cVar20._M_current;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                *)local_418);
  } while( true );
  end_memory = local_3f8;
  lVar14 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_iterate",(double)(lVar14 - lVar12),obj_size,start_memory_00,(size_t)end_memory);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  iVar25 = 0;
  psVar22 = end_memory_01;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",0x100);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar15 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_418);
      iVar25 = iVar25 + 1;
      pvVar15->second = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_308,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar15 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_418);
      iVar25 = iVar25 + 1;
      pvVar15->second = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22)
  ;
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  iVar25 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar15 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_418);
      iVar25 = iVar25 + 1;
      pvVar15->second = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar15 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_418);
      iVar25 = iVar25 + 1;
      pvVar15->second = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  psVar24 = local_310;
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar33._8_4_ = (int)puVar5;
    auVar33._0_8_ = puVar5;
    auVar33._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar23 = (pointer)0x0;
    auVar33 = auVar33 ^ _DAT_0013b020;
    auVar39 = _DAT_0013b010;
    do {
      auVar46 = auVar39 ^ auVar47;
      if ((bool)(~(auVar33._4_4_ < auVar46._4_4_ ||
                  auVar33._0_4_ < auVar46._0_4_ && auVar46._4_4_ == auVar33._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar23 * 4) = (int)psVar23;
      }
      if (auVar46._12_4_ <= auVar33._12_4_ &&
          (auVar46._8_4_ <= auVar33._8_4_ || auVar46._12_4_ != auVar33._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar23 * 4) =
             (int)psVar23 + 1;
      }
      psVar23 = (pointer)((long)&psVar23->group + 2);
      lVar12 = auVar39._8_8_;
      auVar39._0_8_ = auVar39._0_8_ + 2;
      auVar39._8_8_ = lVar12 + 2;
    } while (psVar22 != psVar23);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseDenseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar34._8_4_ = (int)puVar5;
    auVar34._0_8_ = puVar5;
    auVar34._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar34 = auVar34 ^ _DAT_0013b020;
    auVar40 = _DAT_0013b010;
    do {
      auVar46 = auVar40 ^ auVar47;
      if ((bool)(~(auVar34._4_4_ < auVar46._4_4_ ||
                  auVar34._0_4_ < auVar46._0_4_ && auVar46._4_4_ == auVar34._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar24 * 4) = (int)psVar24;
      }
      if (auVar46._12_4_ <= auVar34._12_4_ &&
          (auVar46._8_4_ <= auVar34._8_4_ || auVar46._12_4_ != auVar34._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar24 * 4) =
             (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar12 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar12 + 2;
    } while (psVar22 != psVar24);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  iVar25 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  uVar26 = 1;
  if (0 < obj_size) {
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      google::
      dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
      ::find<HashObject<256,32>>
                ((iterator *)&local_78,
                 (dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                  *)local_308,(HashObject<256,_32> *)local_418);
      psVar22 = (pointer)(ulong)((pointer)local_78.pos.row_begin._M_current != local_c8 + local_d8);
      uVar26 = uVar26 ^ (pointer)local_78.pos.row_begin._M_current != local_c8 + local_d8;
      iVar25 = iVar25 + 1;
    } while (obj_size != iVar25);
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_fetch_empty",(double)(lVar14 - lVar12),obj_size,start_memory_01,(size_t)psVar22);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  iVar25 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar15 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_418);
      iVar25 = iVar25 + 1;
      pvVar15->second = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      google::
      dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(key_type *)local_418);
      iVar25 = iVar25 + 1;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar15 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_418);
      iVar1 = iVar25 + 1;
      pvVar15->second = iVar1;
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      google::
      dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(HashObject<256,_32> *)local_418);
      iVar25 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_418._0_4_ = iVar25;
      memset(local_418 + 4,iVar25,0xfc);
      pvVar15 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_418);
      iVar25 = iVar25 + 1;
      pvVar15->second = iVar25;
    } while (obj_size != iVar25);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar14 = std::chrono::_V2::steady_clock::now();
  lVar12 = local_d8 * 0x104;
  end_memory_00 = local_c8;
  if (local_d8 == 0) {
LAB_00123f91:
    ppVar16 = local_c8 + local_d8;
    if (end_memory_00 != ppVar16) {
      uVar26 = 1;
      do {
        uVar26 = uVar26 ^ end_memory_00->second;
        do {
          end_memory_00 = end_memory_00 + 1;
          if (end_memory_00 == ppVar16) goto LAB_00123ff7;
          iVar25 = (end_memory_00->first).i_;
        } while ((local_1e8 == iVar25) || (local_e8 != 0 && (int)local_2e8 == iVar25));
      } while (end_memory_00 != ppVar16);
      goto LAB_00123ff7;
    }
  }
  else {
    do {
      iVar25 = (end_memory_00->first).i_;
      if ((local_1e8 != iVar25) && (local_e8 == 0 || (int)local_2e8 != iVar25)) goto LAB_00123f91;
      end_memory_00 = end_memory_00 + 1;
      lVar12 = lVar12 + -0x104;
    } while (lVar12 != 0);
  }
  uVar26 = 1;
LAB_00123ff7:
  lVar12 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_iterate",(double)(lVar12 - lVar14),obj_size,start_memory_02,(size_t)end_memory_00);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  psVar22 = end_memory_01;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",0x100);
  local_418 = (undefined1  [8])local_3e8;
  cStack_410._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x3f800000);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar17 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar17 = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  local_418 = (undefined1  [8])local_3e8;
  cStack_410._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x3f800000);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_418,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar17 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar17 = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22)
  ;
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  local_418 = (undefined1  [8])local_3e8;
  cStack_410._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x3f800000);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar17 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar17 = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar17 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar17 = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  psVar24 = local_310;
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = local_310[-1].bitmap + 5;
    auVar35._8_4_ = (int)puVar5;
    auVar35._0_8_ = puVar5;
    auVar35._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar23 = (pointer)0x0;
    auVar35 = auVar35 ^ _DAT_0013b020;
    auVar41 = _DAT_0013b010;
    do {
      auVar46 = auVar41 ^ auVar47;
      if ((bool)(~(auVar35._4_4_ < auVar46._4_4_ ||
                  auVar35._0_4_ < auVar46._0_4_ && auVar46._4_4_ == auVar35._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar23 * 4) = (int)psVar23;
      }
      if (auVar46._12_4_ <= auVar35._12_4_ &&
          (auVar46._8_4_ <= auVar35._8_4_ || auVar46._12_4_ != auVar35._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar23 * 4) =
             (int)psVar23 + 1;
      }
      psVar23 = (pointer)((long)&psVar23->group + 2);
      lVar12 = auVar41._8_8_;
      auVar41._0_8_ = auVar41._0_8_ + 2;
      auVar41._8_8_ = lVar12 + 2;
    } while (psVar22 != psVar23);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar36._8_4_ = (int)puVar5;
    auVar36._0_8_ = puVar5;
    auVar36._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar36 = auVar36 ^ _DAT_0013b020;
    auVar42 = _DAT_0013b010;
    do {
      auVar46 = auVar42 ^ auVar47;
      if ((bool)(~(auVar36._4_4_ < auVar46._4_4_ ||
                  auVar36._0_4_ < auVar46._0_4_ && auVar46._4_4_ == auVar36._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar24 * 4) = (int)psVar24;
      }
      if (auVar46._12_4_ <= auVar36._12_4_ &&
          (auVar46._8_4_ <= auVar36._8_4_ || auVar46._12_4_ != auVar36._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar24 * 4) =
             (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar12 = auVar42._8_8_;
      auVar42._0_8_ = auVar42._0_8_ + 2;
      auVar42._8_8_ = lVar12 + 2;
    } while (psVar22 != psVar24);
  }
  time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  local_418 = (undefined1  [8])local_3e8;
  cStack_410._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x3f800000);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  uVar26 = 1;
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      iVar18 = std::
               _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_418,(key_type *)local_308);
      psVar22 = (pointer)(ulong)(iVar18.
                                 super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>
                                 ._M_cur != (__node_type *)0x0);
      uVar26 = uVar26 ^ iVar18.
                        super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      iVar25 = iVar25 + 1;
    } while (obj_size != iVar25);
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_fetch_empty",(double)(lVar14 - lVar12),obj_size,start_memory_03,(size_t)psVar22);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  local_418 = (undefined1  [8])local_3e8;
  cStack_410._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x3f800000);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar17 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar17 = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      std::
      _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_418,local_308);
      iVar25 = iVar25 + 1;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  local_418 = (undefined1  [8])local_3e8;
  cStack_410._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x3f800000);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar17 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)local_308);
      iVar1 = iVar25 + 1;
      *pmVar17 = iVar1;
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      std::
      _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_418,(key_type *)local_308);
      iVar25 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  local_418 = (undefined1  [8])local_3e8;
  cStack_410._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,0x3f800000);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar17 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar17 = iVar25;
    } while (obj_size != iVar25);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  uVar26 = 1;
  for (cVar20._M_current = local_408._M_current;
      cVar20._M_current !=
      (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
       *)0x0; cVar20._M_current =
                   *(sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                     **)&((pointer)cVar20._M_current)->first) {
    uVar26 = uVar26 ^ *(uint *)(((pointer)((long)cVar20._M_current + 0x104))->first).buffer_;
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_iterate",(double)(lVar14 - lVar12),obj_size,start_memory_04,(size_t)psVar22);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",0x100);
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_410;
  cStack_410._M_current = cStack_410._M_current & 0xffffffff00000000;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_3f8 = (pointer)cStack_400._M_current;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar19 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar19 = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)end_memory_01);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_418);
  cStack_410._M_current = cStack_410._M_current & 0xffffffff00000000;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_410;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_3f8 = (pointer)cStack_400._M_current;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar19 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar19 = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,
         (size_t)end_memory_01);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_418);
  cStack_410._M_current = cStack_410._M_current & 0xffffffff00000000;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_410;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_3f8 = (pointer)cStack_400._M_current;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar19 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar19 = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar19 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar19 = iVar25;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)end_memory_01
        );
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_418);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  psVar22 = local_310;
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    end_memory_01 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = local_310[-1].bitmap + 5;
    auVar37._8_4_ = (int)puVar5;
    auVar37._0_8_ = puVar5;
    auVar37._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar37 = auVar37 ^ _DAT_0013b020;
    auVar43 = _DAT_0013b010;
    do {
      auVar46 = auVar43 ^ auVar47;
      if ((bool)(~(auVar46._4_4_ == auVar37._4_4_ && auVar37._0_4_ < auVar46._0_4_ ||
                  auVar37._4_4_ < auVar46._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar24 * 4) = (int)psVar24;
      }
      if ((auVar46._12_4_ != auVar37._12_4_ || auVar46._8_4_ <= auVar37._8_4_) &&
          auVar46._12_4_ <= auVar37._12_4_) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar24 * 4) =
             (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar12 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + 2;
      auVar43._8_8_ = lVar12 + 2;
    } while (end_memory_01 != psVar24);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseMap<HashObject<256,32>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_418
            );
  auVar47 = _DAT_0013b020;
  if (0 < obj_size) {
    end_memory_01 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar22[-1].bitmap + 5;
    auVar38._8_4_ = (int)puVar5;
    auVar38._0_8_ = puVar5;
    auVar38._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar38 = auVar38 ^ _DAT_0013b020;
    auVar44 = _DAT_0013b010;
    do {
      auVar46 = auVar44 ^ auVar47;
      if ((bool)(~(auVar46._4_4_ == auVar38._4_4_ && auVar38._0_4_ < auVar46._0_4_ ||
                  auVar38._4_4_ < auVar46._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
      }
      if ((auVar46._12_4_ != auVar38._12_4_ || auVar46._8_4_ <= auVar38._8_4_) &&
          auVar46._12_4_ <= auVar38._12_4_) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
             (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar12 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 2;
      auVar44._8_8_ = lVar12 + 2;
    } while (end_memory_01 != psVar22);
  }
  time_map_fetch<EasyUseMap<HashObject<256,32>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  p_Var2 = (_Base_ptr)(local_308 + 8);
  local_308._8_4_ = _S_red;
  local_2f8 = (_Base_ptr)0x0;
  local_2e0 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_2f0 = p_Var2;
  local_2e8 = p_Var2;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar26 = 1;
  }
  else {
    uVar26 = 1;
    end_memory_01 = (pointer)0x0;
    do {
      iVar25 = (int)end_memory_01;
      p_Var29 = p_Var2;
      p_Var30 = p_Var2;
      p_Var10 = local_2f8;
      if (local_2f8 != (_Base_ptr)0x0) {
        do {
          p_Var27 = p_Var10;
          p_Var28 = p_Var29;
          _Var4 = p_Var27[1]._M_color;
          p_Var29 = p_Var27;
          if ((int)_Var4 < iVar25) {
            p_Var29 = p_Var28;
          }
          p_Var10 = (&p_Var27->_M_left)[(int)_Var4 < iVar25];
        } while ((&p_Var27->_M_left)[(int)_Var4 < iVar25] != (_Base_ptr)0x0);
        if (p_Var29 != p_Var2) {
          if ((int)_Var4 < iVar25) {
            p_Var27 = p_Var28;
          }
          p_Var30 = p_Var29;
          if (iVar25 < (int)p_Var27[1]._M_color) {
            p_Var30 = p_Var2;
          }
        }
      }
      uVar26 = uVar26 ^ p_Var30 != p_Var2;
      end_memory_01 = (pointer)(ulong)(iVar25 + 1U);
    } while (iVar25 + 1U != obj_size);
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_fetch_empty",(double)(lVar14 - lVar12),obj_size,start_memory_05,(size_t)end_memory_01)
  ;
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308);
  cStack_410._M_current = cStack_410._M_current & 0xffffffff00000000;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_410;
  local_3f8 = (const_nonempty_iterator)&cStack_410;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
  }
  else {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar19 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar19 = iVar25;
    } while (obj_size != iVar25);
    iVar25 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar12 = std::chrono::_V2::steady_clock::now();
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pVar48 = std::
               _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      std::
      _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      *)local_418,(_Base_ptr)pVar48.first._M_node,(_Base_ptr)pVar48.second._M_node);
      iVar25 = iVar25 + 1;
    } while (obj_size != iVar25);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)end_memory_01)
  ;
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_418);
  cStack_410._M_current = cStack_410._M_current & 0xffffffff00000000;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_410;
  local_3f8 = (const_nonempty_iterator)&cStack_410;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar19 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      iVar1 = iVar25 + 1;
      *pmVar19 = iVar1;
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pVar48 = std::
               _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      std::
      _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      *)local_418,(_Base_ptr)pVar48.first._M_node,(_Base_ptr)pVar48.second._M_node);
      iVar25 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar47 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar47._0_8_ - lVar12),obj_size,auVar47._8_8_,(size_t)end_memory_01)
  ;
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_418);
  cStack_410._M_current = cStack_410._M_current & 0xffffffff00000000;
  local_408._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_410;
  local_3f8 = (const_nonempty_iterator)&cStack_410;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar25 = 0;
    do {
      local_308._0_4_ = iVar25;
      memset(local_308 + 4,iVar25,0xfc);
      pmVar19 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_418,(key_type *)local_308);
      iVar25 = iVar25 + 1;
      *pmVar19 = iVar25;
    } while (obj_size != iVar25);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar12 = std::chrono::_V2::steady_clock::now();
  uVar26 = 1;
  for (cVar20._M_current = cStack_400._M_current;
      (const_nonempty_iterator)cVar20._M_current != (const_nonempty_iterator)&cStack_410;
      cVar20._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)std::_Rb_tree_increment(cVar20._M_current)) {
    uVar26 = uVar26 ^ *(uint *)((long)(((const_nonempty_iterator)((long)cVar20._M_current + 0x104))
                                      ->first).buffer_ + 0x18);
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_iterate",(double)(lVar14 - lVar12),obj_size,start_memory_06,(size_t)end_memory_01);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_418);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}